

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary.cpp
# Opt level: O0

index_type *
booster::locale::boundary::impl_icu::map_direct(boundary_type t,BreakIterator *it,int reserve)

{
  long *plVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  long *in_RDX;
  int in_ESI;
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  *in_RDI;
  int i;
  int n;
  UErrorCode err;
  int32_t *buf;
  int32_t membuf [8];
  vector<int,_std::allocator<int>_> buffer;
  int pos;
  BreakIterator *rbbi;
  index_type *indx;
  value_type *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff20;
  vector<int,_std::allocator<int>_> *__x;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int local_b0;
  int local_a8;
  int local_a4;
  vector<int,_std::allocator<int>_> *local_a0;
  vector<int,_std::allocator<int>_> local_98;
  undefined8 uStack_80;
  vector<int,_std::allocator<int>_> local_78;
  break_info local_60;
  int local_4c;
  break_info local_48;
  long *local_38;
  undefined1 local_1d;
  long *local_18;
  int local_c;
  
  local_1d = 0;
  local_18 = in_RDX;
  local_c = in_ESI;
  std::
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  ::vector((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            *)0x25b59f);
  std::
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  ::reserve(in_RDI,CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_38 = local_18;
  break_info::break_info(&local_48);
  std::
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  ::push_back((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
               *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
              in_stack_ffffffffffffff08);
  (**(code **)(*local_18 + 0x50))();
  local_4c = 0;
  while (iVar2 = (**(code **)(*local_18 + 0x68))(), iVar2 != -1) {
    local_4c = iVar2;
    break_info::break_info(&local_60,(long)iVar2);
    std::
    vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    ::push_back((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                in_stack_ffffffffffffff08);
    if ((local_c == 0) || (local_38 == (long *)0x0)) {
      pvVar4 = std::
               vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
               ::back((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                       *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      pvVar4->rule = pvVar4->rule | 0xf;
    }
    else {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x25b684);
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      uStack_80 = 0;
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_a0 = &local_98;
      local_a4 = 0;
      local_a8 = (**(code **)(*local_38 + 0xa0))(local_38,local_a0,8,&local_a4);
      if (local_a4 == 0xf) {
        __x = &local_78;
        local_a0 = (vector<int,_std::allocator<int>_> *)
                   std::vector<int,_std::allocator<int>_>::front
                             ((vector<int,_std::allocator<int>_> *)
                              CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)in_RDI,CONCAT44(iVar2,local_a8),
                   (value_type_conflict *)__x);
        plVar1 = local_38;
        in_stack_ffffffffffffff20 = local_a0;
        sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_78);
        local_a8 = (**(code **)(*plVar1 + 0xa0))
                             (plVar1,in_stack_ffffffffffffff20,sVar3 & 0xffffffff,&local_a4);
      }
      locale::impl_icu::check_and_throw_icu_error(U_ZERO_ERROR);
      for (local_b0 = 0; local_b0 < local_a8; local_b0 = local_b0 + 1) {
        in_stack_ffffffffffffff14 = local_c;
        if (local_c == 1) {
          if ((*(int *)((long)&(local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + (long)local_b0 * 4) < 0) ||
             (99 < *(int *)((long)&(local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                   .super__Vector_impl_data._M_start + (long)local_b0 * 4))) {
            if ((*(int *)((long)&(local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + (long)local_b0 * 4) < 100) ||
               (199 < *(int *)((long)&(local_a0->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start + (long)local_b0 * 4)
               )) {
              if ((*(int *)((long)&(local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                   .super__Vector_impl_data._M_start + (long)local_b0 * 4) < 200) ||
                 (299 < *(int *)((long)&(local_a0->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_start +
                                (long)local_b0 * 4))) {
                if ((*(int *)((long)&(local_a0->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_start + (long)local_b0 * 4)
                     < 300) ||
                   (399 < *(int *)((long)&(local_a0->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data._M_start +
                                  (long)local_b0 * 4))) {
                  if ((399 < *(int *)((long)&(local_a0->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_start + (long)local_b0 * 4))
                     && (*(int *)((long)&(local_a0->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_start +
                                 (long)local_b0 * 4) < 500)) {
                    pvVar4 = std::
                             vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                             ::back((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                                     *)CONCAT44(1,in_stack_ffffffffffffff10));
                    pvVar4->rule = pvVar4->rule | 0xf0000;
                  }
                }
                else {
                  pvVar4 = std::
                           vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                           ::back((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                                   *)CONCAT44(1,in_stack_ffffffffffffff10));
                  pvVar4->rule = pvVar4->rule | 0xf000;
                }
              }
              else {
                pvVar4 = std::
                         vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                         ::back((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                                 *)CONCAT44(1,in_stack_ffffffffffffff10));
                pvVar4->rule = pvVar4->rule | 0xf00;
              }
            }
            else {
              pvVar4 = std::
                       vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                       ::back((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                               *)CONCAT44(1,in_stack_ffffffffffffff10));
              pvVar4->rule = pvVar4->rule | 0xf0;
            }
          }
          else {
            pvVar4 = std::
                     vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                     ::back((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                             *)CONCAT44(1,in_stack_ffffffffffffff10));
            pvVar4->rule = pvVar4->rule | 0xf;
          }
        }
        else if (local_c == 2) {
          if ((*(int *)((long)&(local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + (long)local_b0 * 4) < 0) ||
             (99 < *(int *)((long)&(local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                   .super__Vector_impl_data._M_start + (long)local_b0 * 4))) {
            if ((99 < *(int *)((long)&(local_a0->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start + (long)local_b0 * 4)
                ) && (*(int *)((long)&(local_a0->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start + (long)local_b0 * 4)
                      < 200)) {
              pvVar4 = std::
                       vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                       ::back((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                               *)CONCAT44(2,in_stack_ffffffffffffff10));
              pvVar4->rule = pvVar4->rule | 0xf0;
            }
          }
          else {
            pvVar4 = std::
                     vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                     ::back((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                             *)CONCAT44(2,in_stack_ffffffffffffff10));
            pvVar4->rule = pvVar4->rule | 0xf;
          }
        }
        else if (local_c == 3) {
          if ((*(int *)((long)&(local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + (long)local_b0 * 4) < 0) ||
             (99 < *(int *)((long)&(local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                   .super__Vector_impl_data._M_start + (long)local_b0 * 4))) {
            if ((99 < *(int *)((long)&(local_a0->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start + (long)local_b0 * 4)
                ) && (*(int *)((long)&(local_a0->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start + (long)local_b0 * 4)
                      < 200)) {
              pvVar4 = std::
                       vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                       ::back((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                               *)CONCAT44(3,in_stack_ffffffffffffff10));
              pvVar4->rule = pvVar4->rule | 0xf0;
            }
          }
          else {
            pvVar4 = std::
                     vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                     ::back((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                             *)CONCAT44(3,in_stack_ffffffffffffff10));
            pvVar4->rule = pvVar4->rule | 0xf;
          }
        }
      }
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff20);
    }
  }
  return in_RDI;
}

Assistant:

index_type map_direct(boundary_type t,icu::BreakIterator *it,int reserve)
{
    index_type indx;
    indx.reserve(reserve);
#if U_ICU_VERSION_MAJOR_NUM >= 52
    icu::BreakIterator *rbbi=it;
#else
    icu::RuleBasedBreakIterator *rbbi=dynamic_cast<icu::RuleBasedBreakIterator *>(it);
#endif
    
    indx.push_back(break_info());
    it->first();
    int pos=0;
    while((pos=it->next())!=icu::BreakIterator::DONE) {
        indx.push_back(break_info(pos));
        /// Character does not have any specific break types
        if(t!=character && rbbi) {
            //
            // There is a collapse for MSVC: int32_t defined by both boost::cstdint and icu...
            // So need to pick one ;(
            //
            std::vector< ::int32_t> buffer;
            ::int32_t membuf[8]={0}; // try not to use memory allocation if possible
            ::int32_t *buf=membuf;

            UErrorCode err=U_ZERO_ERROR;
            int n = rbbi->getRuleStatusVec(buf,8,err);
            
            if(err == U_BUFFER_OVERFLOW_ERROR) {
                buf=&buffer.front();
                buffer.resize(n,0);
                n = rbbi->getRuleStatusVec(buf,buffer.size(),err);
            }

            check_and_throw_icu_error(err);

            for(int i=0;i<n;i++) {
                switch(t) {
                case word:
                    if(UBRK_WORD_NONE<=buf[i] && buf[i]<UBRK_WORD_NONE_LIMIT)
                        indx.back().rule |= word_none;
                    else if(UBRK_WORD_NUMBER<=buf[i] && buf[i]<UBRK_WORD_NUMBER_LIMIT)
                        indx.back().rule |= word_number;
                    else if(UBRK_WORD_LETTER<=buf[i] && buf[i]<UBRK_WORD_LETTER_LIMIT)
                        indx.back().rule |= word_letter;
                    else if(UBRK_WORD_KANA<=buf[i] && buf[i]<UBRK_WORD_KANA_LIMIT)
                        indx.back().rule |= word_kana;
                    else if(UBRK_WORD_IDEO<=buf[i] && buf[i]<UBRK_WORD_IDEO_LIMIT)
                        indx.back().rule |= word_ideo;
                    break;

                case line:
                    if(UBRK_LINE_SOFT<=buf[i] && buf[i]<UBRK_LINE_SOFT_LIMIT)
                        indx.back().rule |= line_soft;
                    else if(UBRK_LINE_HARD<=buf[i] && buf[i]<UBRK_LINE_HARD_LIMIT)
                        indx.back().rule |= line_hard;
                    break;

                case sentence:
                    if(UBRK_SENTENCE_TERM<=buf[i] && buf[i]<UBRK_SENTENCE_TERM_LIMIT)
                        indx.back().rule |= sentence_term;
                    else if(UBRK_SENTENCE_SEP<=buf[i] && buf[i]<UBRK_SENTENCE_SEP_LIMIT)
                        indx.back().rule |= sentence_sep;
                    break;
                default:
                    ;
                }
            }
        }
        else {
            indx.back().rule |=character_any; // Baisc mark... for character
        }
    }
    return indx;
}